

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O3

Vector<Fad<double>_> * __thiscall
Vector<Fad<double>_>::operator=(Vector<Fad<double>_> *this,Fad<double> *val)

{
  double *pdVar1;
  long *plVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (this->num_elts == 0) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "Vector< T >& Vector< T >::operator = (const T& val), unallocated vector","");
    plVar2 = local_50;
    if (local_48 != 0) {
      if (local_50 == (long *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a342a8);
      }
      else {
        sVar3 = strlen((char *)local_50);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)plVar2,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  else if (0 < this->num_elts) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      pdVar1 = (double *)((long)&this->ptr_to_data->val_ + lVar5);
      *pdVar1 = val->val_;
      Vector<double>::operator=((Vector<double> *)(pdVar1 + 1),&val->dx_);
      pdVar1[3] = val->defaultVal;
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar4 < this->num_elts);
  }
  return this;
}

Assistant:

Vector< T >& Vector< T >::operator = (const T& val)
{
  if (num_elts != 0)
    for (int i=0; i<num_elts; ++i)
      ptr_to_data[i] = val;
  else error("Vector< T >& Vector< T >::operator = (const T& val), unallocated vector");

  return *this;
}